

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O0

void __thiscall
flatbuffers::lobster::LobsterGenerator::GenEnum
          (LobsterGenerator *this,EnumDef *enum_def,string *code_ptr)

{
  bool bVar1;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar2;
  reference ppEVar3;
  string local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  EnumVal *local_b0;
  EnumVal *ev;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_a0;
  const_iterator it;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *code;
  string *code_ptr_local;
  EnumDef *enum_def_local;
  LobsterGenerator *this_local;
  
  if (((enum_def->super_Definition).generated & 1U) == 0) {
    local_28 = code_ptr;
    code = code_ptr;
    code_ptr_local = (string *)enum_def;
    enum_def_local = (EnumDef *)this;
    CheckNameSpace(this,&enum_def->super_Definition,code_ptr);
    GenComment((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(code_ptr_local + 2),code,(CommentConfig *)0x0,"");
    NormalizedName_abi_cxx11_(&local_88,this,(Definition *)code_ptr_local);
    std::operator+(&local_68,"enum ",&local_88);
    std::operator+(&local_48,&local_68,":\n");
    std::__cxx11::string::operator+=((string *)local_28,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    pvVar2 = EnumDef::Vals((EnumDef *)code_ptr_local);
    local_a0._M_current =
         (EnumVal **)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar2)
    ;
    while( true ) {
      pvVar2 = EnumDef::Vals((EnumDef *)code_ptr_local);
      ev = (EnumVal *)
           std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end(pvVar2)
      ;
      bVar1 = __gnu_cxx::operator!=
                        (&local_a0,
                         (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                          *)&ev);
      if (!bVar1) break;
      ppEVar3 = __gnu_cxx::
                __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                ::operator*(&local_a0);
      local_b0 = *ppEVar3;
      GenComment(&local_b0->doc_comment,code,(CommentConfig *)0x0,"    ");
      std::operator+(&local_170,"    ",code_ptr_local);
      std::operator+(&local_150,&local_170,"_");
      NormalizedName_abi_cxx11_(&local_190,this,local_b0);
      std::operator+(&local_130,&local_150,&local_190);
      std::operator+(&local_110,&local_130," = ");
      EnumDef::ToString_abi_cxx11_(&local_1b0,(EnumDef *)code_ptr_local,local_b0);
      std::operator+(&local_f0,&local_110,&local_1b0);
      std::operator+(&local_d0,&local_f0,"\n");
      std::__cxx11::string::operator+=((string *)local_28,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      __gnu_cxx::
      __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
      ::operator++(&local_a0);
    }
    std::__cxx11::string::operator+=((string *)local_28,"\n");
  }
  return;
}

Assistant:

void GenEnum(const EnumDef &enum_def, std::string *code_ptr) {
    if (enum_def.generated) return;
    std::string &code = *code_ptr;
    CheckNameSpace(enum_def, &code);
    GenComment(enum_def.doc_comment, code_ptr, nullptr, "");
    code += "enum " + NormalizedName(enum_def) + ":\n";
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      GenComment(ev.doc_comment, code_ptr, nullptr, "    ");
      code += "    " + enum_def.name + "_" + NormalizedName(ev) + " = " +
              enum_def.ToString(ev) + "\n";
    }
    code += "\n";
  }